

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_draw.c
# Opt level: O3

void blur(guint8 *buf,int w,int h)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  
  if (0 < h) {
    uVar7 = 0;
    uVar8 = 0;
    do {
      if (1 < w) {
        uVar4 = 0;
        iVar5 = (uint)buf[uVar8 * (long)w] * 2;
        do {
          bVar1 = buf[uVar4 + uVar7];
          lVar3 = uVar4 + uVar7 + 1;
          buf[uVar4 + uVar7] = (guint8)(iVar5 + (uint)buf[lVar3] + (uint)bVar1 >> 2);
          uVar4 = uVar4 + 1;
          iVar5 = (uint)buf[lVar3] + (uint)bVar1;
        } while (w - 1 != uVar4);
      }
      uVar8 = uVar8 + 1;
      uVar7 = (ulong)(uint)((int)uVar7 + w);
    } while (uVar8 != (uint)h);
  }
  if (0 < w) {
    uVar7 = (ulong)(uint)w;
    uVar8 = 0;
    pbVar6 = buf;
    do {
      if (1 < h) {
        uVar4 = (ulong)(h - 1);
        pbVar9 = pbVar6;
        iVar5 = (uint)buf[uVar8] * 2;
        do {
          bVar1 = *pbVar9;
          bVar2 = pbVar9[uVar7];
          *pbVar9 = (byte)(iVar5 + (uint)bVar2 + (uint)bVar1 >> 2);
          pbVar9 = pbVar9 + uVar7;
          uVar4 = uVar4 - 1;
          iVar5 = (uint)bVar2 + (uint)bVar1;
        } while (uVar4 != 0);
      }
      uVar8 = uVar8 + 1;
      pbVar6 = pbVar6 + 1;
    } while (uVar8 != uVar7);
  }
  return;
}

Assistant:

static void blur(guint8 *buf, int w, int h) {
    int x, y;
    unsigned int osum, nsum;

    for (y = 0; y < h; ++y) {
        osum = 2 * buf[y * w];
        for (x = 0; x < w - 1; ++x) {
            nsum = buf[y * w + x] + buf[y * w + x + 1];
            buf[y * w + x] = (osum + nsum) >> 2;
            osum = nsum;
        }
    }

    for (x = 0; x < w; ++x) {
        osum = 2 * buf[x];
        for (y = 0; y < h - 1; ++y) {
            nsum = buf[y * w + x] + buf[(y + 1) * w + x];
            buf[y * w + x] = (osum + nsum) >> 2;
            osum = nsum;
        }
    }
}